

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::fillWithMetaballs(PixelBufferAccess *dst,int numBalls,deUint32 seed)

{
  int iVar1;
  InternalError *this;
  pointer pVVar2;
  int y;
  ulong uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> points;
  Random rnd;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_60;
  deRandom local_48;
  Vec4 local_38;
  
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] != 1) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,"dst.getDepth() == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
               ,0x3d7);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_60,(long)numBalls,(allocator_type *)&local_48);
  deRandom_init(&local_48,seed);
  if (0 < numBalls) {
    uVar3 = 0;
    do {
      fVar5 = deRandom_getFloat(&local_48);
      fVar6 = deRandom_getFloat(&local_48);
      local_60.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3].m_data[0] = fVar5;
      local_60.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3].m_data[1] = fVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)numBalls != uVar3);
  }
  iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  if (0 < iVar4) {
    iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
    y = 0;
    do {
      if (0 < iVar1) {
        iVar4 = 0;
        do {
          if (local_60.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_60.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_38.m_data[0] = 0.0;
          }
          else {
            local_38.m_data[0] = 0.0;
            pVVar2 = local_60.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              fVar5 = (float)iVar4 / (float)iVar1 - pVVar2->m_data[0];
              fVar6 = (float)y / (float)(dst->super_ConstPixelBufferAccess).m_size.m_data[1] -
                      pVVar2->m_data[1];
              local_38.m_data[0] = local_38.m_data[0] + 0.01 / (fVar5 * fVar5 + fVar6 * fVar6);
              pVVar2 = pVVar2 + 1;
            } while (pVVar2 != local_60.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_38.m_data[1] = local_38.m_data[0];
          local_38.m_data[2] = local_38.m_data[0];
          local_38.m_data[3] = local_38.m_data[0];
          PixelBufferAccess::setPixel(dst,&local_38,iVar4,y,0);
          iVar4 = iVar4 + 1;
          iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
        } while (iVar4 < iVar1);
        iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
      }
      y = y + 1;
    } while (y < iVar4);
  }
  if (local_60.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fillWithMetaballs (const PixelBufferAccess& dst, int numBalls, deUint32 seed)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	std::vector<Vec2>	points(numBalls);
	de::Random			rnd(seed);

	for (int i = 0; i < numBalls; i++)
	{
		float x = rnd.getFloat();
		float y = rnd.getFloat();
		points[i] = (Vec2(x, y));
	}

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		Vec2 p((float)x/(float)dst.getWidth(), (float)y/(float)dst.getHeight());

		float sum = 0.0f;
		for (std::vector<Vec2>::const_iterator i = points.begin(); i != points.end(); i++)
		{
			Vec2	d = p - *i;
			float	f = 0.01f / (d.x()*d.x() + d.y()*d.y());

			sum += f;
		}

		dst.setPixel(Vec4(sum), x, y);
	}
}